

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void init_hl_sf(HIGH_LEVEL_SPEED_FEATURES *hl_sf)

{
  HIGH_LEVEL_SPEED_FEATURES *hl_sf_local;
  
  hl_sf->frame_parameter_update = 1;
  hl_sf->recode_loop = '\x02';
  hl_sf->recode_tolerance = 0x19;
  hl_sf->high_precision_mv_usage = '\x01';
  hl_sf->superres_auto_search_type = '\0';
  hl_sf->disable_extra_sc_testing = 0;
  hl_sf->second_alt_ref_filtering = 1;
  hl_sf->adjust_num_frames_for_arf_filtering = 0;
  hl_sf->accurate_bit_estimate = 0;
  hl_sf->weight_calc_level_in_tf = 0;
  hl_sf->allow_sub_blk_me_in_tf = 0;
  hl_sf->disable_ref_frame_mvs = 0;
  return;
}

Assistant:

static inline void init_hl_sf(HIGH_LEVEL_SPEED_FEATURES *hl_sf) {
  // best quality defaults
  hl_sf->frame_parameter_update = 1;
  hl_sf->recode_loop = ALLOW_RECODE;
  // Recode loop tolerance %.
  hl_sf->recode_tolerance = 25;
  hl_sf->high_precision_mv_usage = CURRENT_Q;
  hl_sf->superres_auto_search_type = SUPERRES_AUTO_ALL;
  hl_sf->disable_extra_sc_testing = 0;
  hl_sf->second_alt_ref_filtering = 1;
  hl_sf->adjust_num_frames_for_arf_filtering = 0;
  hl_sf->accurate_bit_estimate = 0;
  hl_sf->weight_calc_level_in_tf = 0;
  hl_sf->allow_sub_blk_me_in_tf = 0;
  hl_sf->disable_ref_frame_mvs = 0;
}